

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsCpp.cpp
# Opt level: O0

void __thiscall gdsAREF::reset(gdsAREF *this)

{
  gdsAREF *this_local;
  
  std::__cxx11::string::operator=((string *)&this->name,"");
  std::bitset<16UL>::reset(&this->aref_transformation_flags);
  this->reflection = false;
  this->angle = 0.0;
  this->scale = 1.0;
  this->colCnt = 0;
  this->rowCnt = 0;
  this->xCor = 0;
  this->yCor = 0;
  this->xCorRow = 0;
  this->yCorRow = 0;
  this->xCorCol = 0;
  this->yCorCol = 0;
  this->propattr = 0;
  std::__cxx11::string::operator=((string *)&this->propvalue,"");
  return;
}

Assistant:

void gdsAREF::reset()
{
  name = "\0";
  aref_transformation_flags.reset();
  reflection = false;
  angle = 0;
  scale = 1;
  colCnt = 0;
  rowCnt = 0;
  xCor = 0;
  yCor = 0;
  xCorRow = 0; // X_2
  yCorRow = 0; // Y_2
  xCorCol = 0; // X_3
  yCorCol = 0; // Y_3
  propattr = 0;
  propvalue = "\0";
}